

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<int> __thiscall kj::anon_unknown_55::tryParseInteger<int>(anon_unknown_55 *this,StringPtr *s)

{
  int iVar1;
  Maybe<long_long> local_38;
  long local_28;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  min = (longlong)s;
  s_local = (StringPtr *)this;
  iVar1 = MinValue_::operator_cast_to_int((MinValue_ *)&minValue);
  max = (longlong)iVar1;
  iVar1 = MaxValue_::operator_cast_to_int((MaxValue_ *)&maxValue);
  local_28 = (long)iVar1;
  tryParseSigned((anon_unknown_55 *)&local_38,(StringPtr *)min,max,local_28);
  Maybe<int>::Maybe<long_long>((Maybe<int> *)this,&local_38);
  Maybe<long_long>::~Maybe(&local_38);
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}